

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::operator==(Kernel *a,Kernel *b)

{
  code *pcVar1;
  KernelCase KVar2;
  KernelCase KVar3;
  RBFKernel *this;
  RBFKernel *a_00;
  PolyKernel *a_01;
  PolyKernel *b_00;
  SigmoidKernel *this_00;
  SigmoidKernel *a_02;
  RBFKernel *b_01;
  SigmoidKernel *b_02;
  Kernel *b_local;
  Kernel *a_local;
  
  KVar2 = Kernel::kernel_case(a);
  KVar3 = Kernel::kernel_case(b);
  if (KVar2 == KVar3) {
    KVar2 = Kernel::kernel_case(a);
    switch(KVar2) {
    case KERNEL_NOT_SET:
      a_local._7_1_ = false;
      break;
    case kLinearKernel:
      a_local._7_1_ = true;
      break;
    case kRbfKernel:
      this = Kernel::rbfkernel(a);
      a_00 = Kernel::rbfkernel(b);
      a_local._7_1_ = operator==((Specification *)this,a_00,b_01);
      break;
    case kPolyKernel:
      a_01 = Kernel::polykernel(a);
      b_00 = Kernel::polykernel(b);
      a_local._7_1_ = operator==(a_01,b_00);
      break;
    case kSigmoidKernel:
      this_00 = Kernel::sigmoidkernel(a);
      a_02 = Kernel::sigmoidkernel(b);
      a_local._7_1_ = operator==((Specification *)this_00,a_02,b_02);
      break;
    default:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const Kernel& a,
                        const Kernel& b) {
            if (a.kernel_case() != b.kernel_case()) {
                return false;
            }
            switch (a.kernel_case()) {
                case Kernel::kLinearKernel:
                    return true; // no parameters
                case Kernel::kRbfKernel:
                    return a.rbfkernel() == b.rbfkernel();
                case Kernel::kPolyKernel:
                    return a.polykernel() == b.polykernel();
                case Kernel::kSigmoidKernel:
                    return a.sigmoidkernel() == b.sigmoidkernel();
                case Kernel::KERNEL_NOT_SET:
                    return false;
            }
        }